

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsboxd.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  Daemon *local_10;
  
  if (argc == 2) {
    pcVar2 = argv[1];
    iVar1 = strcmp(pcVar2,"stop");
    if (iVar1 == 0) {
      pcVar2 = "(cat /run/libsboxd.pid | xargs kill -s SIGTERM); rm /run/libsboxd.pid";
    }
    else {
      iVar1 = strcmp(pcVar2,"kill");
      if (iVar1 == 0) {
        pcVar2 = "(cat /run/libsboxd.pid | xargs kill -s SIGKILL); rm /run/libsboxd.pid";
      }
      else {
        iVar1 = strcmp(pcVar2,"killall");
        if (iVar1 != 0) goto LAB_00106398;
        pcVar2 = "rm /run/libsboxd.pid; killall libsboxd -s SIGKILL";
      }
    }
    iVar1 = system(pcVar2);
    _exit(iVar1);
  }
LAB_00106398:
  std::make_unique<Daemon>();
  Daemon::run(local_10);
}

Assistant:

int main(int argc, char *argv[]) {
    if (argc == 2 && strcmp(argv[1], "stop") == 0) {
        _exit(system("(cat /run/libsboxd.pid | xargs kill -s SIGTERM); rm /run/libsboxd.pid"));
    }
    if (argc == 2 && strcmp(argv[1], "kill") == 0) {
        _exit(system("(cat /run/libsboxd.pid | xargs kill -s SIGKILL); rm /run/libsboxd.pid"));
    }
    if (argc == 2 && strcmp(argv[1], "killall") == 0) {
        _exit(system("rm /run/libsboxd.pid; killall libsboxd -s SIGKILL"));
    }

    std::make_unique<Daemon>()->run();
}